

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu2.c
# Opt level: O0

void hal_vp8hw_asic_probe_update(DXVA_PicParams_VP8 *p,RK_U8 *probTbl)

{
  uint local_2c;
  uint local_28;
  RK_U32 k;
  RK_U32 j;
  RK_U32 i;
  RK_U8 *dst;
  RK_U8 *probTbl_local;
  DXVA_PicParams_VP8 *p_local;
  
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x163,
               "hal_vp8hw_asic_probe_update");
  }
  *probTbl = p->probe_skip_false;
  probTbl[1] = p->prob_intra;
  probTbl[2] = p->prob_last;
  probTbl[3] = p->prob_golden;
  probTbl[4] = (p->stVP8Segments).mb_segment_tree_probs[0];
  probTbl[5] = (p->stVP8Segments).mb_segment_tree_probs[1];
  probTbl[6] = (p->stVP8Segments).mb_segment_tree_probs[2];
  probTbl[7] = '\0';
  probTbl[8] = p->intra_16x16_prob[0];
  probTbl[9] = p->intra_16x16_prob[1];
  probTbl[10] = p->intra_16x16_prob[2];
  probTbl[0xb] = p->intra_16x16_prob[3];
  probTbl[0xc] = p->intra_chroma_prob[0];
  probTbl[0xd] = p->intra_chroma_prob[1];
  probTbl[0xe] = p->intra_chroma_prob[2];
  probTbl[0xf] = '\0';
  probTbl[0x10] = p->vp8_mv_update_probs[0][0];
  probTbl[0x11] = p->vp8_mv_update_probs[1][0];
  probTbl[0x12] = p->vp8_mv_update_probs[0][1];
  probTbl[0x13] = p->vp8_mv_update_probs[1][1];
  probTbl[0x14] = p->vp8_mv_update_probs[0][0x11];
  probTbl[0x15] = p->vp8_mv_update_probs[0][0x12];
  probTbl[0x16] = p->vp8_mv_update_probs[1][0x11];
  probTbl[0x17] = p->vp8_mv_update_probs[1][0x12];
  _j = probTbl + 0x18;
  for (k = 0; k < 2; k = k + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 4) {
      *_j = p->vp8_mv_update_probs[k][local_28 + 9];
      _j[1] = p->vp8_mv_update_probs[k][local_28 + 10];
      _j[2] = p->vp8_mv_update_probs[k][local_28 + 0xb];
      _j[3] = p->vp8_mv_update_probs[k][local_28 + 0xc];
      _j = _j + 4;
    }
  }
  for (k = 0; k < 2; k = k + 1) {
    *_j = p->vp8_mv_update_probs[k][2];
    _j[1] = p->vp8_mv_update_probs[k][3];
    _j[2] = p->vp8_mv_update_probs[k][4];
    _j[3] = p->vp8_mv_update_probs[k][5];
    _j[4] = p->vp8_mv_update_probs[k][6];
    _j[5] = p->vp8_mv_update_probs[k][7];
    _j[6] = p->vp8_mv_update_probs[k][8];
    _j[7] = '\0';
    _j = _j + 8;
  }
  _j = probTbl + 0x38;
  for (k = 0; k < 4; k = k + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        *_j = p->vp8_coef_update_probs[k][local_28][local_2c][0];
        _j[1] = p->vp8_coef_update_probs[k][local_28][local_2c][1];
        _j[2] = p->vp8_coef_update_probs[k][local_28][local_2c][2];
        _j[3] = p->vp8_coef_update_probs[k][local_28][local_2c][3];
        _j = _j + 4;
      }
    }
  }
  _j = probTbl + 0x1b8;
  for (k = 0; k < 4; k = k + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        *_j = p->vp8_coef_update_probs[k][local_28][local_2c][4];
        _j[1] = p->vp8_coef_update_probs[k][local_28][local_2c][5];
        _j[2] = p->vp8_coef_update_probs[k][local_28][local_2c][6];
        _j[3] = p->vp8_coef_update_probs[k][local_28][local_2c][7];
        _j[4] = p->vp8_coef_update_probs[k][local_28][local_2c][8];
        _j[5] = p->vp8_coef_update_probs[k][local_28][local_2c][9];
        _j[6] = p->vp8_coef_update_probs[k][local_28][local_2c][10];
        _j[7] = '\0';
        _j = _j + 8;
      }
    }
  }
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x1bb,
               "hal_vp8hw_asic_probe_update");
  }
  return;
}

Assistant:

static void hal_vp8hw_asic_probe_update(DXVA_PicParams_VP8 *p, RK_U8 *probTbl)
{
    RK_U8   *dst;
    RK_U32  i, j, k;

    FUN_T("FUN_IN");
    /* first probs */
    dst = probTbl;

    dst[0] = p->probe_skip_false;
    dst[1] = p->prob_intra;
    dst[2] = p->prob_last;
    dst[3] = p->prob_golden;
    dst[4] = p->stVP8Segments.mb_segment_tree_probs[0];
    dst[5] = p->stVP8Segments.mb_segment_tree_probs[1];
    dst[6] = p->stVP8Segments.mb_segment_tree_probs[2];
    dst[7] = 0; /*unused*/

    dst += 8;
    dst[0] = p->intra_16x16_prob[0];
    dst[1] = p->intra_16x16_prob[1];
    dst[2] = p->intra_16x16_prob[2];
    dst[3] = p->intra_16x16_prob[3];
    dst[4] = p->intra_chroma_prob[0];
    dst[5] = p->intra_chroma_prob[1];
    dst[6] = p->intra_chroma_prob[2];
    dst[7] = 0; /*unused*/

    /* mv probs */
    dst += 8;
    dst[0] = p->vp8_mv_update_probs[0][0]; /* is short */
    dst[1] = p->vp8_mv_update_probs[1][0];
    dst[2] = p->vp8_mv_update_probs[0][1]; /* sign */
    dst[3] = p->vp8_mv_update_probs[1][1];
    dst[4] = p->vp8_mv_update_probs[0][8 + 9];
    dst[5] = p->vp8_mv_update_probs[0][9 + 9];
    dst[6] = p->vp8_mv_update_probs[1][8 + 9];
    dst[7] = p->vp8_mv_update_probs[1][9 + 9];
    dst += 8;
    for ( i = 0 ; i < 2 ; ++i ) {
        for ( j = 0 ; j < 8 ; j += 4 ) {
            dst[0] = p->vp8_mv_update_probs[i][j + 9 + 0];
            dst[1] = p->vp8_mv_update_probs[i][j + 9 + 1];
            dst[2] = p->vp8_mv_update_probs[i][j + 9 + 2];
            dst[3] = p->vp8_mv_update_probs[i][j + 9 + 3];
            dst += 4;
        }
    }
    for ( i = 0 ; i < 2 ; ++i ) {
        dst[0] =  p->vp8_mv_update_probs[i][0 + 2];
        dst[1] =  p->vp8_mv_update_probs[i][1 + 2];
        dst[2] =  p->vp8_mv_update_probs[i][2 + 2];
        dst[3] =  p->vp8_mv_update_probs[i][3 + 2];
        dst[4] =  p->vp8_mv_update_probs[i][4 + 2];
        dst[5] =  p->vp8_mv_update_probs[i][5 + 2];
        dst[6] =  p->vp8_mv_update_probs[i][6 + 2];
        dst[7] = 0; /*unused*/
        dst += 8;
    }

    /* coeff probs (header part) */
    dst = (RK_U8*)probTbl;
    dst += (8 * 7);
    for ( i = 0 ; i < 4 ; ++i ) {
        for ( j = 0 ; j < 8 ; ++j ) {
            for ( k = 0 ; k < 3 ; ++k ) {
                dst[0] = p->vp8_coef_update_probs[i][j][k][0];
                dst[1] = p->vp8_coef_update_probs[i][j][k][1];
                dst[2] = p->vp8_coef_update_probs[i][j][k][2];
                dst[3] = p->vp8_coef_update_probs[i][j][k][3];
                dst += 4;
            }
        }
    }

    /* coeff probs (footer part) */
    dst = (RK_U8*)probTbl;
    dst += (8 * 55);
    for ( i = 0 ; i < 4 ; ++i ) {
        for ( j = 0 ; j < 8 ; ++j ) {
            for ( k = 0 ; k < 3 ; ++k ) {
                dst[0] = p->vp8_coef_update_probs[i][j][k][4];
                dst[1] = p->vp8_coef_update_probs[i][j][k][5];
                dst[2] = p->vp8_coef_update_probs[i][j][k][6];
                dst[3] = p->vp8_coef_update_probs[i][j][k][7];
                dst[4] = p->vp8_coef_update_probs[i][j][k][8];
                dst[5] = p->vp8_coef_update_probs[i][j][k][9];
                dst[6] = p->vp8_coef_update_probs[i][j][k][10];
                dst[7] = 0; /*unused*/
                dst += 8;
            }
        }
    }
    FUN_T("FUN_OUT");
    return ;
}